

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

vector<const_char_*,_std::allocator<const_char_*>_> *
EnvProperty::DoDuplicateAndUpdateEnv
          (vector<const_char_*,_std::allocator<const_char_*>_> *__return_storage_ptr__,
          override_set *overrides)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  size_type __n;
  size_type_conflict sVar2;
  reference this;
  ulong uVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  basic_string_view<char,_std::char_traits<char>_> __y;
  value_type local_f0;
  char *local_e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  char *local_d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  char *local_c8;
  char *it;
  char *new_k_and_v;
  size_t sz;
  type *v;
  type *k_1;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_98;
  iterator __end1;
  iterator __begin1;
  override_set *__range1;
  int local_60;
  int i;
  string_view k;
  size_type pos;
  string_view k_and_v;
  char **p;
  override_set *overrides_local;
  vector<const_char_*,_std::allocator<const_char_*>_> *vec;
  
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(__return_storage_ptr__);
  k_and_v._M_str = _environ;
  do {
    if (*(long *)k_and_v._M_str == 0) {
      __end1 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(overrides);
      local_98._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(overrides);
      do {
        bVar1 = __gnu_cxx::operator!=(&__end1,&local_98);
        if (!bVar1) {
          local_f0 = (value_type)0x0;
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    (__return_storage_ptr__,&local_f0);
          return __return_storage_ptr__;
        }
        k_1 = &__gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end1)->first;
        v = std::get<0ul,std::__cxx11::string,std::__cxx11::string>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)k_1);
        sz = (size_t)std::get<1ul,std::__cxx11::string,std::__cxx11::string>
                               ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)k_1);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          lVar4 = std::__cxx11::string::size();
          lVar5 = std::__cxx11::string::size();
          new_k_and_v = (char *)(lVar4 + 2 + lVar5);
          it = (char *)operator_new__((ulong)new_k_and_v);
          local_d0._M_current = (char *)std::__cxx11::string::begin();
          local_d8 = (char *)std::__cxx11::string::end();
          pcVar6 = std::copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char*>
                             (local_d0,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )local_d8,it);
          local_c8 = pcVar6 + 1;
          *pcVar6 = '=';
          local_e0._M_current = (char *)std::__cxx11::string::begin();
          local_e8 = (char *)std::__cxx11::string::end();
          pcVar6 = std::copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char*>
                             (local_e0,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )local_e8,local_c8);
          local_c8 = pcVar6 + 1;
          *pcVar6 = '\0';
          if (local_c8 != it + (long)new_k_and_v) {
            fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                    ,0x709,"it","==","new_k_and_v + sz");
            abort();
          }
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    (__return_storage_ptr__,&it);
        }
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++(&__end1);
      } while( true );
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&pos,*(char **)k_and_v._M_str);
    __n = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&pos,'=',0);
    if (__n == 0xffffffffffffffff) {
      syscall(1,2,"Check failed: pos != std::string_view::npos\n",0x2c);
      abort();
    }
    __y = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&pos,0,__n);
    sVar2 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(overrides);
    local_60 = (int)sVar2;
    do {
      local_60 = local_60 + -1;
      if (local_60 < 0) break;
      this = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](overrides,(long)local_60);
      __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
      bVar1 = std::operator==(__x,__y);
    } while (!bVar1);
    if (local_60 < 0) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                (__return_storage_ptr__,(value_type *)k_and_v._M_str);
    }
    k_and_v._M_str = k_and_v._M_str + 8;
  } while( true );
}

Assistant:

static std::vector<const char*> DoDuplicateAndUpdateEnv(override_set overrides) {
    std::vector<const char*> vec;

    for (const char* const *p = environ; *p; p++) {
      std::string_view k_and_v{*p};
      auto pos = k_and_v.find('=');
      CHECK(pos != std::string_view::npos);
      std::string_view k = k_and_v.substr(0, pos);
      int i = overrides.size() - 1;;
      for (; i >= 0; i--) {
        if (overrides[i].first == k) {
          break;
        }
      }
      if (i < 0) {
        vec.push_back(*p);
      }
    }

    for (const auto& [k, v] : overrides) {
      if (v.empty()) {
        continue;
      }

      size_t sz = k.size() + v.size() + 1 + 1;
      char* new_k_and_v = new char[sz];
      auto it = std::copy(k.begin(), k.end(), new_k_and_v);
      *it++ = '=';
      it = std::copy(v.begin(), v.end(), it);
      *it++ = '\0';
      CHECK_EQ(it, new_k_and_v + sz);

      vec.push_back(new_k_and_v);
    }

    vec.push_back(nullptr);

    return vec;
  }